

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool anon_unknown.dwarf_522f::error(err_t error_num,path *p,error_code *ec,char *message)

{
  char *__s;
  error_code *path1_arg;
  int val;
  filesystem_error *this;
  error_category *peVar1;
  error_code ec_00;
  error_code local_70 [2];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *message_local;
  error_code *ec_local;
  path *p_local;
  err_t error_num_local;
  
  local_28 = message;
  message_local = (char *)ec;
  ec_local = (error_code *)p;
  p_local._4_4_ = error_num;
  if (error_num == 0) {
    if (ec != (error_code *)0x0) {
      boost::system::error_code::clear(ec);
    }
  }
  else {
    if (ec == (error_code *)0x0) {
      this = (filesystem_error *)__cxa_allocate_exception(0x50);
      __s = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      val = p_local._4_4_;
      path1_arg = ec_local;
      peVar1 = boost::system::system_category();
      boost::system::error_code::error_code(local_70,val,peVar1);
      ec_00._4_4_ = 0;
      ec_00.m_val = local_70[0].m_val;
      ec_00.m_cat = local_70[0].m_cat;
      boost::filesystem::filesystem_error::filesystem_error(this,&local_48,(path *)path1_arg,ec_00);
      __cxa_throw(this,&boost::filesystem::filesystem_error::typeinfo,
                  boost::filesystem::filesystem_error::~filesystem_error);
    }
    peVar1 = boost::system::system_category();
    boost::system::error_code::assign(ec,error_num,peVar1);
  }
  return p_local._4_4_ != 0;
}

Assistant:

bool error(err_t error_num, const path& p, error_code* ec, const char* message)
  {
    if (!error_num)
    {
      if (ec != 0) ec->clear();
    }
    else  
    { //  error
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(message,
          p, error_code(error_num, system_category())));
      else
        ec->assign(error_num, system_category());
    }
    return error_num != 0;
  }